

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::InitExp_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this,ExprList *el)

{
  bool bVar1;
  reference n;
  size_type sVar2;
  reference pvVar3;
  undefined1 local_108 [8];
  Value val;
  AST ast;
  ExprList *el_local;
  Decompiler *this_local;
  
  ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)el;
  bVar1 = intrusive_list<wabt::Expr>::empty(el);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!el.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler.cc"
                  ,0x296,"std::string wabt::Decompiler::InitExp(const ExprList &)");
  }
  AST::AST((AST *)&val.precedence,&this->mc,(Func *)0x0);
  AST::Construct((AST *)&val.precedence,
                 (ExprList *)
                 ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage,1,0,false);
  n = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast,0);
  DecompileExpr((Value *)local_108,this,n,(Node *)0x0);
  sVar2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size
                    ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast);
  bVar1 = false;
  if (sVar2 == 1) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_108);
    bVar1 = sVar2 == 1;
  }
  if (!bVar1) {
    __assert_fail("ast.exp_stack.size() == 1 && val.v.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler.cc"
                  ,0x29a,"std::string wabt::Decompiler::InitExp(const ExprList &)");
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_108,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar3);
  Value::~Value((Value *)local_108);
  AST::~AST((AST *)&val.precedence);
  return __return_storage_ptr__;
}

Assistant:

std::string InitExp(const ExprList &el) {
    assert(!el.empty());
    AST ast(mc, nullptr);
    ast.Construct(el, 1, 0, false);
    auto val = DecompileExpr(ast.exp_stack[0], nullptr);
    assert(ast.exp_stack.size() == 1 && val.v.size() == 1);
    return std::move(val.v[0]);
  }